

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_0::TestCase60::run(TestCase60 *this)

{
  long lVar1;
  byte c [4];
  Builder builder;
  Reader data3;
  uchar local_5c [4];
  Reader local_58;
  Reader local_48;
  Reader local_38;
  ArrayPtr<unsigned_char> local_28;
  
  builtin_memcpy(local_5c,"baz",4);
  local_48.super_ArrayPtr<const_unsigned_char>.ptr = local_5c;
  local_48.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  lVar1 = 0;
  do {
    if ("foobarbaz"[lVar1 + 6] != local_5c[lVar1]) {
      if (kj::_::Debug::minSeverity < 3) {
        local_58.super_ArrayPtr<const_unsigned_char>.ptr = "baz";
        local_58.super_ArrayPtr<const_unsigned_char>.size_ = 3;
        kj::_::Debug::log<char_const(&)[45],capnp::Data::Reader,capnp::Data::Reader&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                   ,0x47,ERROR,
                   "\"failed: expected \" \"(dataLit(\\\"baz\\\")) == (data3)\", dataLit(\"baz\"), data3"
                   ,(char (*) [45])"failed: expected (dataLit(\"baz\")) == (data3)",&local_58,
                   &local_48);
      }
      break;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_58.super_ArrayPtr<const_unsigned_char>.ptr = local_5c;
  local_58.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  lVar1 = 0;
  do {
    if ("foobarbaz"[lVar1 + 6] != local_5c[lVar1]) {
      if (kj::_::Debug::minSeverity < 3) {
        local_38.super_ArrayPtr<const_unsigned_char>.ptr = "baz";
        local_38.super_ArrayPtr<const_unsigned_char>.size_ = 3;
        kj::_::Debug::log<char_const(&)[47],capnp::Data::Reader,capnp::Data::Builder&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
                   ,0x4a,ERROR,
                   "\"failed: expected \" \"(dataLit(\\\"baz\\\")) == (builder)\", dataLit(\"baz\"), builder"
                   ,(char (*) [47])"failed: expected (dataLit(\"baz\")) == (builder)",&local_38,
                   (Builder *)&local_58);
      }
      break;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (((local_58.super_ArrayPtr<const_unsigned_char>.ptr[1] != 'a') ||
      (local_58.super_ArrayPtr<const_unsigned_char>.ptr[2] != 'z')) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_28.ptr = local_58.super_ArrayPtr<const_unsigned_char>.ptr + 1;
    local_38.super_ArrayPtr<const_unsigned_char>.ptr = "az";
    local_38.super_ArrayPtr<const_unsigned_char>.size_ = 2;
    local_28.size_ = 2;
    kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,kj::ArrayPtr<unsigned_char>>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x4c,ERROR,
               "\"failed: expected \" \"(dataLit(\\\"az\\\")) == (builder.slice(1, 3))\", dataLit(\"az\"), builder.slice(1, 3)"
               ,(char (*) [58])"failed: expected (dataLit(\"az\")) == (builder.slice(1, 3))",
               &local_38,&local_28);
  }
  return;
}

Assistant:

TEST(Blob, Data) {
  Data::Reader data = dataLit("foo");

  EXPECT_EQ(dataLit("foo"), data);
  EXPECT_EQ(3u, data.size());

  Data::Reader data2 = dataLit("bar");
  EXPECT_EQ(dataLit("bar"), data2);

  byte c[4] = "baz";
  Data::Reader data3(c, 3);
  EXPECT_EQ(dataLit("baz"), data3);

  Data::Builder builder(c, 3);
  EXPECT_EQ(dataLit("baz"), builder);

  EXPECT_EQ(dataLit("az"), builder.slice(1, 3));
}